

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_rawget(lua_State *L,int idx)

{
  lu_byte tag_00;
  int iVar1;
  Table *t_00;
  lu_byte tag;
  Table *t;
  int idx_local;
  lua_State *L_local;
  
  t_00 = gettable(L,idx);
  tag_00 = luaH_get(t_00,(TValue *)((L->top).offset + -0x10),(TValue *)((L->top).offset + -0x10));
  (L->top).p = (StkId)((L->top).offset + -0x10);
  iVar1 = finishrawget(L,tag_00);
  return iVar1;
}

Assistant:

LUA_API int lua_rawget (lua_State *L, int idx) {
  Table *t;
  lu_byte tag;
  lua_lock(L);
  api_checkpop(L, 1);
  t = gettable(L, idx);
  tag = luaH_get(t, s2v(L->top.p - 1), s2v(L->top.p - 1));
  L->top.p--;  /* pop key */
  return finishrawget(L, tag);
}